

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::ShaderSourceSplitCase::test(ShaderSourceSplitCase *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  deUint32 dVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  ShaderSourceSplitCase *this_00;
  uint uVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  string lastString;
  ShaderSources sources;
  int lastStringLength;
  string padding;
  Shader shader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [24];
  undefined1 auStack_2a0 [16];
  int *piStack_290;
  int local_27c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ShaderSourceSplitCase *local_258;
  ulong local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  ulong local_240;
  string local_238;
  undefined1 local_218 [8];
  _func_int **local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [6];
  ios_base local_1a0 [264];
  Shader local_98;
  
  local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                 m_log;
  stack0xfffffffffffffd68 = (undefined1  [16])0x0;
  stack0xfffffffffffffd58 = (undefined1  [16])0x0;
  local_2b8._0_16_ = (undefined1  [16])0x0;
  glu::Shader::Shader(&local_98,((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx,
                      this->m_shaderType);
  bVar1 = this->m_explicitLengths;
  generateFullSource_abi_cxx11_(&local_238,this);
  cVar8 = '\n';
  if (bVar1 == false) {
    cVar8 = '\0';
  }
  iVar11 = this->m_numSlices;
  uVar9 = (ulong)iVar11;
  local_240 = local_238._M_string_length;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar9;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_238._M_string_length;
  local_218 = (undefined1  [8])local_208;
  std::__cxx11::string::_M_construct((ulong)local_218,cVar8);
  local_258 = this;
  local_250 = uVar9;
  if (0 < iVar11) {
    do {
      std::__cxx11::string::substr((ulong)&local_278,(ulong)&local_238);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_2d8.field_2._M_allocated_capacity = *psVar5;
        local_2d8.field_2._8_8_ = plVar4[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar5;
        local_2d8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_2d8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2b8,
                 &local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (bVar1 != false) {
        iVar11 = SUB164(auVar2 / auVar14,0);
        local_2d8._M_dataplus._M_p._0_4_ = iVar11;
        if ((int *)auStack_2a0._8_8_ == piStack_290) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_2a0,(iterator)auStack_2a0._8_8_,
                     (int *)&local_2d8);
        }
        else {
          *(int *)auStack_2a0._8_8_ = iVar11;
          auStack_2a0._8_8_ = (int *)(auStack_2a0._8_8_ + 4);
        }
      }
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (local_240 != SUB168(auVar2 / auVar14,0) * local_250) {
    std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&local_238);
    iVar11 = (int)local_2d8._M_string_length;
    local_27c = (int)local_2d8._M_string_length;
    std::operator+(&local_278,&local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2b8,
               &local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (bVar1 != false) {
      if ((int *)auStack_2a0._8_8_ == piStack_290) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)auStack_2a0,(iterator)auStack_2a0._8_8_,
                   &local_27c);
      }
      else {
        *(int *)auStack_2a0._8_8_ = iVar11;
        auStack_2a0._8_8_ = (int *)(auStack_2a0._8_8_ + 4);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = local_258;
  if (local_218 != (undefined1  [8])local_208) {
    operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
  }
  if (this_00->m_randomNullTerm == true) {
    iVar11 = this_00->m_numSlices;
    local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_2d8,
               (long)(local_2b8._8_8_ - local_2b8._0_8_) >> 5,(value_type_conflict1 *)local_218,
               (allocator_type *)&local_278);
    uVar7 = (uint)((ulong)(local_2b8._8_8_ - local_2b8._0_8_) >> 5);
    if (0 < (int)uVar7) {
      lVar6 = (ulong)(uVar7 & 0x7fffffff) - 1;
      auVar12._8_4_ = (int)lVar6;
      auVar12._0_8_ = lVar6;
      auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
      uVar9 = 0;
      auVar12 = auVar12 ^ _DAT_019ec5b0;
      auVar13 = _DAT_019f34d0;
      do {
        auVar14 = auVar13 ^ _DAT_019ec5b0;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *(int *)((long)local_2d8._M_dataplus._M_p + uVar9 * 4) = (int)uVar9;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          *(int *)((long)local_2d8._M_dataplus._M_p + (uVar9 + 1) * 4) = (int)uVar9 + 1;
        }
        uVar9 = uVar9 + 2;
        lVar6 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar6 + 2;
      } while ((uVar7 + 1 & 0xfffffffe) != uVar9);
    }
    de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&this_00->m_rnd,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_2d8._M_dataplus._M_p,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_2d8._M_string_length);
    uVar7 = iVar11 >> 2;
    uVar9 = 1;
    if (1 < (int)uVar7) {
      uVar9 = (ulong)uVar7;
    }
    uVar10 = 0;
    do {
      iVar11 = *(int *)(local_2d8._M_dataplus._M_p + uVar10 * 4);
      std::__cxx11::string::substr((ulong)local_218,(ulong)(local_2b8._0_8_ + (long)iVar11 * 0x20));
      std::__cxx11::string::_M_assign((string *)(local_2b8._0_8_ + (long)iVar11 * 0x20));
      dVar3 = deRandom_getUint32(&(this_00->m_rnd).m_rnd);
      *(uint *)(auStack_2a0._0_8_ + (long)iVar11 * 4) = dVar3 % 10 - 10;
      if (local_218 != (undefined1  [8])local_208) {
        operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
    this_00 = local_258;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      local_2d8.field_2._M_allocated_capacity - (long)local_2d8._M_dataplus._M_p);
      this_00 = local_258;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_218,
             (long)(local_2b8._8_8_ - local_2b8._0_8_) >> 5,(value_type *)&local_2d8,
             (allocator_type *)&local_278);
  if (local_2b8._8_8_ != local_2b8._0_8_) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      *(undefined8 *)((long)local_218 + uVar9 * 8) =
           *(undefined8 *)((long)&((_Alloc_hider *)local_2b8._0_8_)->_M_p + lVar6);
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar9 < (ulong)((long)(local_2b8._8_8_ - local_2b8._0_8_) >> 5));
  }
  iVar11 = (int)((ulong)((long)local_210 - (long)local_218) >> 3);
  if (auStack_2a0._8_8_ == auStack_2a0._0_8_) {
    glu::Shader::setSources(&local_98,iVar11,(char **)local_218,(int *)0x0);
  }
  else {
    glu::Shader::setSources(&local_98,iVar11,(char **)local_218,(int *)auStack_2a0._0_8_);
  }
  if (local_218 != (undefined1  [8])0x0) {
    operator_delete((void *)local_218,local_208[0]._M_allocated_capacity - (long)local_218);
  }
  glu::Shader::compile(&local_98);
  buildProgram(this_00,&local_98);
  if (local_98.m_info.compileOk == false) {
    local_218 = (undefined1  [8])local_248;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"Compilation failed.",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_218,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_210);
    std::ios_base::~ios_base(local_1a0);
    tcu::TestContext::setTestResult
              ((this_00->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Compile failed");
  }
  glu::Shader::~Shader(&local_98);
  if ((pointer)auStack_2a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)auStack_2a0._0_8_,(long)piStack_290 - auStack_2a0._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2b8);
  return;
}

Assistant:

void test (void)
	{
		TestLog&			log			= m_testCtx.getLog();
		glu::RenderContext&	renderCtx	= m_context.getRenderContext();

		ShaderSources		sources;
		glu::Shader			shader		(renderCtx, m_shaderType);

		generateSources(sources);
		setShaderSources(shader, sources);
		shader.compile();

		buildProgram(shader);

		if (!shader.getCompileStatus())
		{
			log << TestLog::Message << "Compilation failed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		}
	}